

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Output.c
# Opt level: O2

WJTL_STATUS TestStrings(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  WJTL_STATUS WVar9;
  WJTL_STATUS WVar10;
  WJTL_STATUS WVar11;
  WJTL_STATUS WVar12;
  WJTL_STATUS WVar13;
  WJTL_STATUS WVar14;
  JL_STATUS JVar15;
  JL_STATUS JVar16;
  JL_STATUS JVar17;
  WJTL_STATUS WVar18;
  WJTL_STATUS WVar19;
  bool Condition;
  bool Condition_00;
  bool Condition_01;
  char *local_40;
  JlDataObject *stringObject;
  
  WVar1 = VerifyOutputString("string","\"string\"",false);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"string\", \"\\\"string\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x102);
  WVar2 = VerifyOutputString(anon_var_dwarf_425 + 10,"null",false);
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\", \"null\", 0 ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x103);
  WVar3 = VerifyOutputString((char *)0x0,"null",false);
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( ((void*)0), \"null\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x104);
  WVar4 = VerifyOutputString(" string ","\" string \"",false);
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \" string \", \"\\\" string \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x106);
  WVar5 = VerifyOutputString(" ","\" \"",false);
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \" \", \"\\\" \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x107);
  WVar6 = VerifyOutputString("it\'s","\"it\'s\"",false);
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"it\'s\", \"\\\"it\'s\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x108);
  WVar7 = VerifyOutputString("\n","\"\\n\"",false);
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\n\", \"\\\"\\\\n\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x109);
  WVar8 = VerifyOutputString("\x01\x02\x03\x04\x05\x06\a\b",
                             "\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\"",false);
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x01\\x02\\x03\\x04\\x05\\x06\\x07\\x08\", \"\\\"\\\\u0001\\\\u0002\\\\u0003\\\\u0004\\\\u0005\\\\u0006\\\\u0007\\\\b\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10a);
  WVar9 = VerifyOutputString("\t\n\v\f\r\x0e\x0f\x10","\"\\t\\n\\u000b\\f\\r\\u000e\\u000f\\u0010\""
                             ,false);
  WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x09\\x0a\\x0b\\x0c\\x0d\\x0e\\x0f\\x10\", \"\\\"\\\\t\\\\n\\\\u000b\\\\f\\\\r\\\\u000e\\\\u000f\\\\u0010\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10b);
  WVar10 = VerifyOutputString("\x11\x12\x13\x14\x15\x16\x17\x18",
                              "\"\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\"",false);
  WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x11\\x12\\x13\\x14\\x15\\x16\\x17\\x18\", \"\\\"\\\\u0011\\\\u0012\\\\u0013\\\\u0014\\\\u0015\\\\u0016\\\\u0017\\\\u0018\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10c);
  WVar11 = VerifyOutputString("\x19\x1a\x1b\x1c\x1d\x1e\x1f ",
                              "\"\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f \"",false);
  WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\x19\\x1a\\x1b\\x1c\\x1d\\x1e\\x1f\\x20\", \"\\\"\\\\u0019\\\\u001a\\\\u001b\\\\u001c\\\\u001d\\\\u001e\\\\u001f \\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10d);
  WVar12 = VerifyOutputString("_\"_","\"_\\\"_\"",false);
  WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"_\\\"_\", \"\\\"_\\\\\\\"_\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x10f);
  WVar13 = VerifyOutputString("_\\_","\"_\\\\_\"",false);
  WjTestLib_Assert(WVar13 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"_\\\\_\", \"\\\"_\\\\\\\\_\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x110);
  WVar14 = VerifyOutputString(anon_var_dwarf_4cd,anon_var_dwarf_94fa,false);
  WjTestLib_Assert(WVar14 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"\\xF0\\x9F\\x98\\x81\", \"\\\"\\xF0\\x9F\\x98\\x81\\\"\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x111);
  stringObject = (JlDataObject *)0x0;
  local_40 = (char *)0x0;
  JVar15 = JlCreateObject(JL_DATA_TYPE_STRING,&stringObject);
  WjTestLib_Assert(JVar15 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlCreateObject( JL_DATA_TYPE_STRING, &stringObject ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xed);
  JVar16 = JlSetObjectString(stringObject,anon_var_dwarf_951c);
  WjTestLib_Assert(JVar16 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlSetObjectString( stringObject, String ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xee);
  JVar17 = JlOutputJson(stringObject,false,&local_40);
  Condition = JVar17 == JL_STATUS_INVALID_DATA;
  WjTestLib_Assert(Condition,
                   "(JlOutputJson( stringObject, 0, &jsonString )) == (JL_STATUS_INVALID_DATA)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xef);
  Condition_00 = local_40 == (char *)0x0;
  WjTestLib_Assert(Condition_00,"(jsonString) == NULL",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xf0);
  JVar17 = JlFreeObjectTree(&stringObject);
  Condition_01 = JVar17 == JL_STATUS_SUCCESS;
  WjTestLib_Assert(Condition_01,
                   "((JL_STATUS)(JlFreeObjectTree( &stringObject ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"VerifyInvalidString",0xf1);
  WjTestLib_Assert((Condition_01 && Condition_00) &&
                   (Condition && (JVar16 == JL_STATUS_SUCCESS && JVar15 == JL_STATUS_SUCCESS)),
                   "((JL_STATUS)(VerifyInvalidString( \"\\xF0\\x9F\\x98Truncated\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x113);
  WVar18 = VerifyOutputString("it\'s","\'it\\\'s\'",true);
  WjTestLib_Assert(WVar18 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputString( \"it\'s\", \"\'it\\\\\'s\'\", 1 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestStrings",0x116);
  WVar19 = WJTL_STATUS_SUCCESS;
  if ((((WVar13 != WJTL_STATUS_SUCCESS || WVar14 != WJTL_STATUS_SUCCESS) ||
       WVar18 != WJTL_STATUS_SUCCESS) ||
      ((WVar11 != WJTL_STATUS_SUCCESS || WVar12 != WJTL_STATUS_SUCCESS) ||
      (WVar10 != WJTL_STATUS_SUCCESS || WVar9 != WJTL_STATUS_SUCCESS))) ||
      ((((WVar5 != WJTL_STATUS_SUCCESS || WVar6 != WJTL_STATUS_SUCCESS) ||
        WVar7 != WJTL_STATUS_SUCCESS) ||
       ((WVar3 != WJTL_STATUS_SUCCESS || WVar4 != WJTL_STATUS_SUCCESS) ||
       (WVar2 != WJTL_STATUS_SUCCESS || WVar1 != WJTL_STATUS_SUCCESS))) ||
      WVar8 != WJTL_STATUS_SUCCESS)) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  if ((!Condition_01 || !Condition_00) ||
      (!Condition || (JVar16 != JL_STATUS_SUCCESS || JVar15 != JL_STATUS_SUCCESS))) {
    WVar19 = WJTL_STATUS_FAILED;
  }
  return WVar19;
}

Assistant:

static
WJTL_STATUS
    TestStrings
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    JL_ASSERT_SUCCESS( VerifyOutputString( "string", "\"string\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "", "null", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( NULL, "null", false ) );

    JL_ASSERT_SUCCESS( VerifyOutputString( " string ", "\" string \"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( " ", "\" \"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "it's", "\"it's\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\n", "\"\\n\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\x01\x02\x03\x04\x05\x06\x07\x08", "\"\\u0001\\u0002\\u0003\\u0004\\u0005\\u0006\\u0007\\b\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\x09\x0a\x0b\x0c\x0d\x0e\x0f\x10", "\"\\t\\n\\u000b\\f\\r\\u000e\\u000f\\u0010\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\x11\x12\x13\x14\x15\x16\x17\x18", "\"\\u0011\\u0012\\u0013\\u0014\\u0015\\u0016\\u0017\\u0018\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\x19\x1a\x1b\x1c\x1d\x1e\x1f\x20", "\"\\u0019\\u001a\\u001b\\u001c\\u001d\\u001e\\u001f \"", false ) );

    JL_ASSERT_SUCCESS( VerifyOutputString( "_\"_", "\"_\\\"_\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "_\\_", "\"_\\\\_\"", false ) );
    JL_ASSERT_SUCCESS( VerifyOutputString( "\xF0\x9F\x98\x81", "\"\xF0\x9F\x98\x81\"", false ) );    // smiley face emoji

    JL_ASSERT_SUCCESS( VerifyInvalidString( "\xF0\x9F\x98Truncated" ) );    // utf8 sequence truncated

    // Test Json5 handling of single quote in a string when using single quotes for string
    JL_ASSERT_SUCCESS( VerifyOutputString( "it's", "'it\\'s'", true ) );

    return TestReturn;
}